

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O1

ElOrderType Q_GetElOrder(QMatrix *Q)

{
  LASErrIdType LVar1;
  ElOrderType EVar2;
  
  LVar1 = LASResult();
  EVar2 = Rowws;
  if (LVar1 == LASOK) {
    EVar2 = Q->ElOrder;
  }
  return EVar2;
}

Assistant:

ElOrderType Q_GetElOrder(QMatrix *Q)
/* returns element order of the matrix Q */
{
    ElOrderType ElOrder;

    if (LASResult() == LASOK) {
        ElOrder = Q->ElOrder;
    } else {
        ElOrder = (ElOrderType)0;
    }
    return(ElOrder);
}